

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberToString.h
# Opt level: O2

json_string * __thiscall
NumberToString::_ftoa_abi_cxx11_
          (json_string *__return_storage_ptr__,NumberToString *this,json_number value)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  ulong val;
  char *__s;
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  allocator local_59;
  char num_str_result [64];
  
  if (0.0 <= value) {
    val = (long)(value - 9.223372036854776e+18) & (long)value >> 0x3f | (long)value;
    auVar5._8_4_ = (int)(val >> 0x20);
    auVar5._0_8_ = val;
    auVar5._12_4_ = 0x45300000;
    dVar6 = (auVar5._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)val) - 4503599627370496.0);
    dVar4 = value - dVar6;
    bVar1 = -1e-05 < dVar4;
    if (dVar6 < value) {
      bVar1 = dVar4 < 1e-05;
    }
    if (bVar1) {
      _uitoa<unsigned_long>(__return_storage_ptr__,val);
      return __return_storage_ptr__;
    }
  }
  dVar4 = (double)(long)value;
  dVar6 = value - dVar4;
  bVar1 = -1e-05 < dVar6;
  if (dVar4 < value) {
    bVar1 = dVar6 < 1e-05;
  }
  if (bVar1) {
    _itoa<long>(__return_storage_ptr__,(long)value);
  }
  else {
    __s = num_str_result;
    snprintf(__s,0x3f,"%f");
    for (; *__s != '\0'; __s = __s + 1) {
      pcVar2 = __s;
      if (*__s == '.') {
        do {
          pcVar3 = pcVar2;
          pcVar2 = __s + 1;
          do {
            __s = pcVar2;
            if (*__s == '\0') {
              *pcVar3 = '\0';
              goto LAB_001285ff;
            }
            pcVar2 = __s + 1;
          } while (*__s == '0');
        } while( true );
      }
    }
LAB_001285ff:
    std::__cxx11::string::string((string *)__return_storage_ptr__,num_str_result,&local_59);
  }
  return __return_storage_ptr__;
}

Assistant:

static json_string _ftoa(json_number value) json_nothrow {
	   #ifndef JSON_LIBRARY
			//ScopeCoverage(_ftoa_coverage, 6);
		  if (json_unlikely(value >= 0.0 && _floatsAreEqual(value, (json_number)((unsigned EXTRA_LONG long)value)))){
			 return _uitoa<unsigned EXTRA_LONG long>((unsigned EXTRA_LONG long)value);
		  } else
		#else
			  //ScopeCoverage(_ftoa_coverage, 5);
	   #endif
		  if (json_unlikely(_floatsAreEqual(value, (json_number)((long EXTRA_LONG)value)))){
			 return _itoa<long EXTRA_LONG>((long EXTRA_LONG)value);
		  }

	   #ifdef JSON_LESS_MEMORY
		  json_auto<json_char> s(64);
	   #else
		  json_char num_str_result[64];
	   #endif
	   #ifdef JSON_UNICODE
		  std::swprintf(num_str_result, 63, LFLOAT_STRING, (EXTRA_LONG double)value);
	   #else
		  //Thanks to Salvor Hardin for this Visual C++ fix
		  #ifdef _MSC_VER
			 _snprintf_s(num_str_result, 63, 63, FLOAT_STRING, (EXTRA_LONG double)value); //yes, 63 appears twice using _snprintf_s()
		  #else
			 snprintf(num_str_result, 63, FLOAT_STRING, (EXTRA_LONG double)value);
		  #endif
	   #endif
	   //strip the trailing zeros
	   for(json_char * pos = &num_str_result[0]; *pos; ++pos){
		  if (json_unlikely(*pos == '.')){  //only care about after the decimal
			 for(json_char * runner = pos + 1; *runner; ++runner){
				 if (json_likely(*runner != JSON_TEXT('0'))){
					 pos = runner + 1;  //have to go to the end 1.0001
				 }
			 }
			 *pos = JSON_TEXT('\0');
			 break;
		  }
	   }
	   return json_string(num_str_result);
    }